

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

void input_dialog_abort_proc(Am_Object *cmd)

{
  Am_Value *value;
  Am_Object local_68;
  undefined1 local_60 [8];
  Am_Object_Method aborter;
  Am_Object widget_cmd;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object text_widget;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object widget;
  Am_Object *cmd_local;
  
  widget.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)cmd);
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)&local_20,0x68);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_18,0x1ec);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)&local_40,0x1eb);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object(&widget_cmd,&local_38);
  Am_Abort_Widget(&widget_cmd);
  Am_Object::~Am_Object(&widget_cmd);
  Am_Object::Get_Object((Am_Object *)&aborter.Call,(Am_Slot_Key)&local_18,0xc5);
  value = Am_Object::Get((Am_Object *)&aborter.Call,0xc9,0);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_60,value);
  Am_Object::Am_Object(&local_68,(Am_Object *)&aborter.Call);
  (*(code *)aborter.from_wrapper)(&local_68);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object((Am_Object *)&aborter.Call);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, input_dialog_abort, (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner().Get_Object(Am_WINDOW);
  Am_Object text_widget =
      widget.Get_Object(Am_DIALOG_GROUP).Get_Object(Am_TEXT_WIDGET);
  Am_Abort_Widget(text_widget);
  // explicitly call dialog box's abort method.  We don't have any
  // implementation parent here, because then this stop method would call
  // the dialog's stop method as well as the abort method.
  // Is there a better way?
  Am_Object widget_cmd = widget.Get_Object(Am_COMMAND);
  Am_Object_Method aborter = widget_cmd.Get(Am_ABORT_DO_METHOD);
  aborter.Call(widget_cmd);
}